

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageInputsXrEnumerateEnvironmentDepthSwapchainImagesMETA
                   (XrEnvironmentDepthSwapchainMETA swapchain,uint32_t imageCapacityInput,
                   uint32_t *imageCountOutput,XrSwapchainImageBaseHeader *images)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  ValidateXrHandleResult VVar5;
  XrResult XVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  uint __val;
  XrSwapchainImageOpenGLKHR *value;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar11;
  string out;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  ostringstream oss;
  string local_2b0;
  string local_290;
  GenValidUsageXrInstanceInfo *local_270;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_268;
  XrEnvironmentDepthSwapchainMETA local_248;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_268.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8[0]._M_dataplus._M_p._0_4_ = 0x3b9f3ab9;
  local_248 = swapchain;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrEnvironmentDepthSwapchainMETA_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &local_268,&local_248,(XrObjectType *)local_1a8);
  VVar5 = VerifyXrEnvironmentDepthSwapchainMETAHandle(&local_248);
  if (VVar5 != VALIDATE_XR_HANDLE_SUCCESS) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Invalid XrEnvironmentDepthSwapchainMETA handle \"swapchain\" ",
               0x3b);
    local_290._M_dataplus._M_p = (pointer)local_248;
    paVar1 = &local_2b0.field_2;
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_2b0,'\x12');
    *local_2b0._M_dataplus._M_p = '0';
    local_2b0._M_dataplus._M_p[1] = 'x';
    pcVar7 = local_2b0._M_dataplus._M_p +
             CONCAT44(local_2b0._M_string_length._4_4_,(uint)local_2b0._M_string_length) + -1;
    lVar8 = 0;
    do {
      bVar2 = *(byte *)((long)&local_290._M_dataplus._M_p + lVar8);
      *pcVar7 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar7[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar8 = lVar8 + 1;
      pcVar7 = pcVar7 + -2;
    } while (lVar8 != 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_2b0._M_dataplus._M_p,
               CONCAT44(local_2b0._M_string_length._4_4_,(uint)local_2b0._M_string_length));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    local_2b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,
               "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-swapchain-parameter","");
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_290,"xrEnumerateEnvironmentDepthSwapchainImagesMETA","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1e0,&local_268);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_2b0,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290,&local_1e0,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (local_1e0.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e0.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e0.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    XVar6 = XR_ERROR_HANDLE_INVALID;
    goto LAB_002885cd;
  }
  pVar11 = HandleInfo<XrEnvironmentDepthSwapchainMETA_T_*>::getWithInstanceInfo
                     (&g_environmentdepthswapchainmeta_info,local_248);
  local_270 = pVar11.second;
  if (images == (XrSwapchainImageBaseHeader *)0x0 && imageCapacityInput != 0) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter","");
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,"xrEnumerateEnvironmentDepthSwapchainImagesMETA","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1f8,&local_268);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_290,
               "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images is NULL, but imageCapacityInput is greater than 0"
               ,"");
    CoreValidLogMessage(local_270,local_1a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b0,&local_1f8,
                        &local_290);
    local_210.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_1f8.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_210.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1f8.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      local_210.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_1f8.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_210.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1f8.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
  else {
    if (imageCountOutput != (uint32_t *)0x0) {
      if (imageCapacityInput != 0 && images != (XrSwapchainImageBaseHeader *)0x0) {
        uVar10 = 0;
        value = (XrSwapchainImageOpenGLKHR *)images;
        do {
          if (value->type == XR_TYPE_SWAPCHAIN_IMAGE_OPENGL_KHR) {
            local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"xrEnumerateEnvironmentDepthSwapchainImagesMETA","");
            XVar6 = ValidateXrStruct(local_270,local_1a8,&local_268,false,true,value);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
              operator_delete(local_1a8[0]._M_dataplus._M_p,
                              local_1a8[0].field_2._M_allocated_capacity + 1);
            }
            if (XVar6 != XR_SUCCESS) {
              local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1a8,
                         "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images","");
              std::__cxx11::string::append((char *)local_1a8);
              cVar4 = '\x01';
              __val = (uint)uVar10;
              if (uVar10 < 10) goto LAB_00288798;
              cVar3 = '\x04';
              goto LAB_0028864e;
            }
          }
          else {
            local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"xrEnumerateEnvironmentDepthSwapchainImagesMETA","");
            XVar6 = ValidateXrStruct(local_270,local_1a8,&local_268,true,false,images);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
              operator_delete(local_1a8[0]._M_dataplus._M_p,
                              local_1a8[0].field_2._M_allocated_capacity + 1);
            }
            if (XVar6 != XR_SUCCESS) {
              local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1a8,
                         "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter","");
              local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2b0,"xrEnumerateEnvironmentDepthSwapchainImagesMETA","");
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector(&local_240,&local_268);
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_290,
                         "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images is invalid"
                         ,"");
              CoreValidLogMessage(local_270,local_1a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b0,
                                  &local_240,&local_290);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_dataplus._M_p != &local_290.field_2) {
                operator_delete(local_290._M_dataplus._M_p,
                                local_290.field_2._M_allocated_capacity + 1);
              }
              if (local_240.
                  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_240.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_240.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_240.
                                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._M_dataplus._M_p == &local_2b0.field_2) goto LAB_00288773;
              goto LAB_00288766;
            }
          }
          uVar10 = uVar10 + 1;
          value = value + 1;
          images = images + 1;
        } while (imageCapacityInput != uVar10);
      }
      XVar6 = XR_SUCCESS;
      goto LAB_002885cd;
    }
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-imageCountOutput-parameter","");
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,"xrEnumerateEnvironmentDepthSwapchainImagesMETA","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_210,&local_268);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_290,
               "Invalid NULL for uint32_t \"imageCountOutput\" which is not optional and must be non-NULL"
               ,"");
    CoreValidLogMessage(local_270,local_1a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_2b0,&local_210,
                        &local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_210.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_210.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_210.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) goto LAB_002885b8;
  goto LAB_002885c8;
  while( true ) {
    if (uVar9 < 10000) goto LAB_00288798;
    uVar10 = (uVar10 & 0xffffffff) / 10000;
    cVar3 = cVar4 + '\x04';
    if (uVar9 < 100000) break;
LAB_0028864e:
    cVar4 = cVar3;
    uVar9 = (uint)uVar10;
    if (uVar9 < 100) {
      cVar4 = cVar4 + -2;
      goto LAB_00288798;
    }
    if (uVar9 < 1000) {
      cVar4 = cVar4 + -1;
      goto LAB_00288798;
    }
  }
  cVar4 = cVar4 + '\x01';
LAB_00288798:
  paVar1 = &local_2b0.field_2;
  local_2b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_2b0,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_2b0._M_dataplus._M_p,(uint)local_2b0._M_string_length,__val);
  std::__cxx11::string::_M_append((char *)local_1a8,(ulong)local_2b0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)local_1a8);
  std::__cxx11::string::append((char *)local_1a8);
  local_2b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b0,
             "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter","");
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,"xrEnumerateEnvironmentDepthSwapchainImagesMETA","");
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            (&local_228,&local_268);
  CoreValidLogMessage(local_270,&local_2b0,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290,&local_228,
                      local_1a8);
  if (local_228.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
LAB_00288766:
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
LAB_00288773:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
LAB_002885b8:
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
LAB_002885c8:
  XVar6 = XR_ERROR_VALIDATION_FAILURE;
LAB_002885cd:
  if (local_268.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return XVar6;
}

Assistant:

XrResult GenValidUsageInputsXrEnumerateEnvironmentDepthSwapchainImagesMETA(
XrEnvironmentDepthSwapchainMETA swapchain,
uint32_t imageCapacityInput,
uint32_t* imageCountOutput,
XrSwapchainImageBaseHeader* images) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(swapchain, XR_OBJECT_TYPE_ENVIRONMENT_DEPTH_SWAPCHAIN_META);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrEnvironmentDepthSwapchainMETAHandle(&swapchain);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrEnvironmentDepthSwapchainMETA handle \"swapchain\" ";
                oss << HandleToHexString(swapchain);
                CoreValidLogMessage(nullptr, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-swapchain-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_environmentdepthswapchainmeta_info.getWithInstanceInfo(swapchain);
        GenValidUsageXrHandleInfo *gen_environmentdepthswapchainmeta_info = info_with_instance.first;
        (void)gen_environmentdepthswapchainmeta_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Optional array must be non-NULL when imageCapacityInput is non-zero
        if (0 != imageCapacityInput && nullptr == images) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                objects_info,
                                "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images is NULL, but imageCapacityInput is greater than 0");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == imageCountOutput) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-imageCountOutput-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA", objects_info,
                                "Invalid NULL for uint32_t \"imageCountOutput\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-imageCountOutput-parameter" type
        if (images) {
            for (uint32_t value_images_inc = 0; value_images_inc < imageCapacityInput; ++value_images_inc) {
#if defined(XR_USE_GRAPHICS_API_OPENGL)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageOpenGLKHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageOpenGLKHR* new_swapchainimageopenglkhr_value = reinterpret_cast<XrSwapchainImageOpenGLKHR*>(images);
                        if (new_swapchainimageopenglkhr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_OPENGL_KHR) {
                            if (nullptr != new_swapchainimageopenglkhr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimageopenglkhr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_OPENGL)
#if defined(XR_USE_GRAPHICS_API_OPENGL_ES)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageOpenGLESKHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageOpenGLESKHR* new_swapchainimageopengleskhr_value = reinterpret_cast<XrSwapchainImageOpenGLESKHR*>(images);
                        if (new_swapchainimageopengleskhr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_OPENGL_ES_KHR) {
                            if (nullptr != new_swapchainimageopengleskhr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimageopengleskhr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_OPENGL_ES)
#if defined(XR_USE_GRAPHICS_API_VULKAN)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageVulkanKHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageVulkanKHR* new_swapchainimagevulkankhr_value = reinterpret_cast<XrSwapchainImageVulkanKHR*>(images);
                        if (new_swapchainimagevulkankhr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_VULKAN_KHR) {
                            if (nullptr != new_swapchainimagevulkankhr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimagevulkankhr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_VULKAN)
#if defined(XR_USE_GRAPHICS_API_D3D11)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageD3D11KHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageD3D11KHR* new_swapchainimaged3d11khr_value = reinterpret_cast<XrSwapchainImageD3D11KHR*>(images);
                        if (new_swapchainimaged3d11khr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_D3D11_KHR) {
                            if (nullptr != new_swapchainimaged3d11khr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimaged3d11khr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_D3D11)
#if defined(XR_USE_GRAPHICS_API_D3D12)
                // Validate if XrSwapchainImageBaseHeader is a child structure of type XrSwapchainImageD3D12KHR and it is valid
                {
                    if (images != nullptr) {
                        XrSwapchainImageD3D12KHR* new_swapchainimaged3d12khr_value = reinterpret_cast<XrSwapchainImageD3D12KHR*>(images);
                        if (new_swapchainimaged3d12khr_value[value_images_inc].type == XR_TYPE_SWAPCHAIN_IMAGE_D3D12_KHR) {
                            if (nullptr != new_swapchainimaged3d12khr_value) {
                                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                                                objects_info, false, true, &new_swapchainimaged3d12khr_value[value_images_inc]);
                                if (XR_SUCCESS != xr_result) {
                                    std::string error_message = "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images";
                                    error_message += "[";
                                    error_message += std::to_string(value_images_inc);
                                    error_message += "]";
                                    error_message += " is invalid";
                                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                                        objects_info,
                                                        error_message);
                                    return XR_ERROR_VALIDATION_FAILURE;
                                    break;
                                } else {
                                    continue;
                                    }
                                }
                        }
                    }
                }
#endif // defined(XR_USE_GRAPHICS_API_D3D12)
                // Validate that the base-structure XrSwapchainImageBaseHeader is valid
                xr_result = ValidateXrStruct(gen_instance_info, "xrEnumerateEnvironmentDepthSwapchainImagesMETA", objects_info,
                                                                true, true, &images[value_images_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateEnvironmentDepthSwapchainImagesMETA-images-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateEnvironmentDepthSwapchainImagesMETA",
                                        objects_info,
                                        "Command xrEnumerateEnvironmentDepthSwapchainImagesMETA param images is invalid");
                    return xr_result;
                }
            }
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}